

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,_ *param_2,ArrayPtr<unsigned_char> *param_3
                         ,undefined8 param_4,CappedArray<char,_17UL> *param_5)

{
  Delimited<kj::ArrayPtr<unsigned_char>_> *params;
  uchar (*value) [3];
  CappedArray<char,_17UL> local_78;
  Delimited<kj::ArrayPtr<unsigned_char>_> local_58;
  _ *local_20;
  DebugComparison<kj::ArrayPtr<unsigned_char>,_unsigned_char_(&)[3]> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<kj::ArrayPtr<unsigned_char>,kj::_::Delimited<kj::ArrayPtr<unsigned_char>>>
            (&local_58,param_2,param_3);
  params = (Delimited<kj::ArrayPtr<unsigned_char>_> *)(local_20 + 0x18);
  tryToCharSequence<unsigned_char[3],kj::CappedArray<char,17ul>>
            (&local_78,*(_ **)(local_20 + 0x10),value);
  concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char>>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (__return_storage_ptr__,(_ *)&local_58,params,(StringPtr *)&local_78,param_5);
  Delimited<kj::ArrayPtr<unsigned_char>_>::~Delimited(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}